

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_lax_indirect_indexed_Test::TestBody
          (CpuTest_lax_indirect_indexed_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar2;
  char *message;
  ReturnAction<int> local_80;
  MatcherBase<unsigned_short> local_70;
  _Any_data local_58 [2];
  AssertionResult gtest_ar;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.y = '\r';
  (this->super_CpuTest).registers.y = '\r';
  (this->super_CpuTest).expected.a = 'B';
  (this->super_CpuTest).expected.x = 'B';
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xb3);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_70,0x4322);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x205,"mmu","read_byte(0x4322)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_80,0x42);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_58,(ReturnAction *)&local_80);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_70);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_70,0x42);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x206,"mmu","read_byte(0x42)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_80,0x34);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_58,(ReturnAction *)&local_80);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_70);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_70,0x43);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x207,"mmu","read_byte(0x43)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_80,0x12);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_58,(ReturnAction *)&local_80);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_70);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_70,0x1241);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_70);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x209,"mmu","read_byte(0x1234 + 0x0D)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_80,0x42);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_58,(ReturnAction *)&local_80);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar2,(Action<unsigned_char_(unsigned_short)> *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_70);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x05');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)&gtest_ar,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x20c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_58[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CpuTest, lax_indirect_indexed) {
    registers.pc = expected.pc = 0x4321;
    registers.y = expected.y = 0x0D;
    expected.a = 0x42;
    expected.x = 0x42;

    stage_instruction(LAX_INDINX);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0x42));
    EXPECT_CALL(mmu, read_byte(0x42)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(0x43)).WillOnce(Return(0x12));

    EXPECT_CALL(mmu, read_byte(0x1234 + 0x0D)).WillOnce(Return(0x42));
    step_execution(5);

    EXPECT_EQ(expected, registers);
}